

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O3

string * __thiscall
glcts::TextureBufferTextureBufferRange::getFragmentShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferTextureBufferRange *this,FormatInfo *info)

{
  stringstream result;
  stringstream local_190 [16];
  undefined1 local_180 [376];
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_180,
             "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nvoid main(void)\n{\n}\n"
             ,0x53);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base((ios_base *)(local_180 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferTextureBufferRange::getFragmentShaderCode(FormatInfo& info) const
{
	DE_UNREF(info);

	std::stringstream result;

	result << "${VERSION}\n"
			  "\n"
			  "${TEXTURE_BUFFER_REQUIRE}\n"
			  "\n"
			  "precision highp float;\n"
			  "\n"
			  "void main(void)\n"
			  "{\n"
			  "}\n";

	return result.str();
}